

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

void copywithendian(char *dest,char *src,int size,int islittle)

{
  char *pcVar1;
  long lVar2;
  
  if (islittle == 1) {
    memcpy(dest,src,(ulong)(uint)size);
    return;
  }
  pcVar1 = dest + size;
  for (lVar2 = 0; pcVar1 = pcVar1 + -1, size != (int)lVar2; lVar2 = lVar2 + 1) {
    *pcVar1 = src[lVar2];
  }
  return;
}

Assistant:

static void copywithendian (char *dest, const char *src,
                            int size, int islittle) {
  if (islittle == nativeendian.little)
    memcpy(dest, src, size);
  else {
    dest += size - 1;
    while (size-- != 0)
      *(dest--) = *(src++);
  }
}